

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# hsts.c
# Opt level: O0

CURLcode hsts_pull(Curl_easy *data,hsts *h)

{
  CURLSTScode CVar1;
  CURLcode CVar2;
  time_t tStack_158;
  CURLcode result;
  time_t expires;
  curl_hstsentry e;
  char buffer [257];
  CURLSTScode sc;
  hsts *h_local;
  Curl_easy *data_local;
  
  if ((data->set).hsts_read != (curl_hstsread_callback)0x0) {
    do {
      expires = (time_t)(e.expire + 0xf);
      e.name = (char *)0x100;
      e.namelen._0_1_ = (byte)e.namelen & 0xfe;
      e.namelen._1_1_ = '\0';
      e.expire[0xf] = '\0';
      CVar1 = (*(data->set).hsts_read)(data,(curl_hstsentry *)&expires,(data->set).hsts_read_userp);
      if (CVar1 == CURLSTS_OK) {
        if (*(char *)expires == '\0') {
          return CURLE_BAD_FUNCTION_ARGUMENT;
        }
        if (e.namelen._1_1_ == '\0') {
          tStack_158 = 0x7fffffffffffffff;
        }
        else {
          tStack_158 = Curl_getdate_capped((char *)((long)&e.namelen + 1));
        }
        CVar2 = hsts_create(h,(char *)expires,((byte)e.namelen & 1) != 0,tStack_158);
        if (CVar2 != CURLE_OK) {
          return CVar2;
        }
      }
      else if (CVar1 == CURLSTS_FAIL) {
        return CURLE_ABORTED_BY_CALLBACK;
      }
    } while (CVar1 == CURLSTS_OK);
  }
  return CURLE_OK;
}

Assistant:

static CURLcode hsts_pull(struct Curl_easy *data, struct hsts *h)
{
  /* if the HSTS read callback is set, use it */
  if(data->set.hsts_read) {
    CURLSTScode sc;
    DEBUGASSERT(h);
    do {
      char buffer[MAX_HSTS_HOSTLEN + 1];
      struct curl_hstsentry e;
      e.name = buffer;
      e.namelen = sizeof(buffer)-1;
      e.includeSubDomains = FALSE; /* default */
      e.expire[0] = 0;
      e.name[0] = 0; /* just to make it clean */
      sc = data->set.hsts_read(data, &e, data->set.hsts_read_userp);
      if(sc == CURLSTS_OK) {
        time_t expires;
        CURLcode result;
        DEBUGASSERT(e.name[0]);
        if(!e.name[0])
          /* bail out if no name was stored */
          return CURLE_BAD_FUNCTION_ARGUMENT;
        if(e.expire[0])
          expires = Curl_getdate_capped(e.expire);
        else
          expires = TIME_T_MAX; /* the end of time */
        result = hsts_create(h, e.name,
                             /* bitfield to bool conversion: */
                             e.includeSubDomains ? TRUE : FALSE,
                             expires);
        if(result)
          return result;
      }
      else if(sc == CURLSTS_FAIL)
        return CURLE_ABORTED_BY_CALLBACK;
    } while(sc == CURLSTS_OK);
  }
  return CURLE_OK;
}